

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_memory.c
# Opt level: O1

int64_t memory_read_seek(archive *a,void *client_data,int64_t offset,int whence)

{
  long lVar1;
  ulong uVar2;
  int64_t iVar3;
  ulong uVar4;
  
  if (whence == 2) {
    lVar1 = *(long *)((long)client_data + 0x10);
  }
  else {
    if (whence == 1) {
      *(long *)((long)client_data + 8) = *(long *)((long)client_data + 8) + offset;
      goto LAB_00120e7f;
    }
    if (whence != 0) {
      return -0x1e;
    }
    lVar1 = *client_data;
  }
  *(int64_t *)((long)client_data + 8) = offset + lVar1;
LAB_00120e7f:
  uVar4 = *client_data;
  uVar2 = *(ulong *)((long)client_data + 8);
  iVar3 = uVar2 - uVar4;
  if ((uVar2 < uVar4) || (uVar4 = *(ulong *)((long)client_data + 0x10), uVar4 < uVar2)) {
    *(ulong *)((long)client_data + 8) = uVar4;
    iVar3 = -0x19;
  }
  return iVar3;
}

Assistant:

static int64_t
memory_read_seek(struct archive *a, void *client_data, int64_t offset, int whence)
{
	struct read_memory_data *mine = (struct read_memory_data *)client_data;

	(void)a; /* UNUSED */
	switch (whence) {
	case SEEK_SET:
		mine->p = mine->start + offset;
		break;
	case SEEK_CUR:
		mine->p += offset;
		break;
	case SEEK_END:
		mine->p = mine->end + offset;
		break;
	default:
		return ARCHIVE_FATAL;
	}
	if (mine->p < mine->start) {
		mine->p = mine->start;
		return ARCHIVE_FAILED;
	}
	if (mine->p > mine->end) {
		mine->p = mine->end;
		return ARCHIVE_FAILED;
	}
	return (mine->p - mine->start);
}